

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

array<cv::Mat,_10UL> *
compute_target_ring_mask
          (array<cv::Mat,_10UL> *__return_storage_ptr__,
          array<cv::RotatedRect,_10UL> *target_ellipses,int img_row,int img_col,bool debug)

{
  void *pvVar1;
  array<cv::Mat,_10UL> *this;
  long lVar2;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *__s;
  __m128 t;
  array<cv::Mat,_10UL> *target_ring_mask;
  array<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_10UL> target_contours;
  _InputOutputArray local_318;
  _InputArray local_300;
  int local_2e8;
  int local_2e4;
  long *local_288;
  undefined8 uStack_280;
  long local_278 [12];
  Mat local_218 [96];
  Mat local_1b8 [128];
  long alStack_138 [3];
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_120 [10];
  
  __s = local_120;
  memset(__s,0,0xf0);
  lVar2 = 0x10;
  do {
    local_288 = (long *)0x0;
    uStack_280 = 0;
    local_278[0] = 0;
    local_2e8 = (int)ROUND(*(float *)((long)target_ellipses->_M_elems + lVar2 + -0x10));
    local_2e4 = (int)ROUND(*(float *)((long)target_ellipses->_M_elems + lVar2 + -0xc));
    local_318.super__OutputArray.super__InputArray.flags =
         (int)ROUND(*(float *)((long)target_ellipses->_M_elems + lVar2 + -8) * 0.5);
    local_318.super__OutputArray.super__InputArray._4_4_ =
         (BADTYPE)ROUND(*(float *)((long)target_ellipses->_M_elems + lVar2 + -4) * 0.5);
    cv::ellipse2Poly((Mat *)&local_2e8,&local_318,
                     (int)*(float *)((long)&target_ellipses->_M_elems[0].center.x + lVar2),0,0x168,1
                     ,&local_288);
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::_M_move_assign(__s,&local_288);
    if (local_288 != (long *)0x0) {
      operator_delete(local_288,local_278[0] - (long)local_288);
    }
    __s = __s + 1;
    lVar2 = lVar2 + 0x14;
  } while (lVar2 != 0xd8);
  lVar2 = 0;
  do {
    cv::Mat::Mat((Mat *)(&__return_storage_ptr__->field_0x0 + lVar2));
    lVar2 = lVar2 + 0x60;
  } while (lVar2 != 0x3c0);
  lVar2 = 0;
  this = __return_storage_ptr__;
  do {
    cv::Mat::zeros((int)(Scalar_ *)&local_288,img_row,img_col);
    cv::Mat::Mat((Mat *)&local_2e8);
    (**(code **)(*local_288 + 0x18))(local_288,(Scalar_ *)&local_288,(Mat *)&local_2e8,0xffffffff);
    cv::Mat::~Mat(local_1b8);
    cv::Mat::~Mat(local_218);
    cv::Mat::~Mat((Mat *)local_278);
    local_318.super__OutputArray.super__InputArray.sz.width = 0;
    local_318.super__OutputArray.super__InputArray.sz.height = 0;
    local_318.super__OutputArray.super__InputArray.flags = 0x3010000;
    local_300.sz.width = 0;
    local_300.sz.height = 0;
    local_300.flags = -0x7efcfff4;
    local_288 = (long *)0x406fe00000000000;
    local_278[1] = 0;
    uStack_280 = 0;
    local_278[0] = 0;
    local_318.super__OutputArray.super__InputArray.obj = (Mat *)&local_2e8;
    local_300.obj =
         (void *)((long)&local_120[0].
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar2);
    cv::fillConvexPoly(&local_318,&local_300,(Scalar_ *)&local_288,8,0);
    cv::Mat::operator=((Mat *)this,(Mat *)&local_2e8);
    cv::Mat::~Mat((Mat *)&local_2e8);
    lVar2 = lVar2 + 0x18;
    this = (array<cv::Mat,_10UL> *)&this->field_0x60;
  } while (lVar2 != 0xf0);
  lVar2 = 0xf0;
  do {
    pvVar1 = *(void **)((long)alStack_138 + lVar2);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)alStack_138 + lVar2 + 0x10) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != 0);
  return __return_storage_ptr__;
}

Assistant:

std::array<cv::Mat, 10> compute_target_ring_mask(
    const std::array<cv::RotatedRect, 10>& target_ellipses, int img_row, int img_col, bool debug = false)
{
    std::array<std::vector<cv::Point>, 10> target_contours;
    std::transform(
        target_ellipses.begin(), target_ellipses.end(), target_contours.begin(), [](const cv::RotatedRect& rect) {
            std::vector<cv::Point> result;
            cv::Size2f size(rect.size.width / 2.f, rect.size.height / 2.f);
            cv::ellipse2Poly(rect.center, size, static_cast<int>(rect.angle), 0, 360, 1, result);
            return result;
        });

    std::array<cv::Mat, 10> target_ring_mask;
    std::transform(target_contours.begin(), target_contours.end(), target_ring_mask.begin(),
        [img_row, img_col](const std::vector<cv::Point>& contours_pts) {
            cv::Mat result = cv::Mat::zeros(img_row, img_col, CV_8U);
            cv::fillConvexPoly(result, contours_pts, 255);
            return result;
        });

    // display_target_contours_masks(target_ring_mask.begin(), target_ring_mask.end());
    return target_ring_mask;
}